

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::SetRepeatedString
          (Reflection *this,Message *message,FieldDescriptor *field,int index,string *value)

{
  int number;
  bool bVar1;
  CppStringType CVar2;
  uint32_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  char *description;
  Descriptor *pDVar4;
  Metadata MVar5;
  string_view src;
  Cord CStack_58;
  string local_48;
  
  MVar5 = Message::GetMetadata(message);
  if (MVar5.reflection != this) {
    pDVar4 = this->descriptor_;
    MVar5 = Message::GetMetadata(message);
    anon_unknown_6::ReportReflectionUsageMessageError
              (pDVar4,MVar5.descriptor,field,"SetRepeatedString");
  }
  pDVar4 = this->descriptor_;
  if (field->containing_type_ == pDVar4) {
    bVar1 = FieldDescriptor::is_repeated(field);
    if (bVar1) {
      if (*(int *)(FieldDescriptor::kTypeToCppTypeMap + (ulong)field->type_ * 4) != 9) {
        anon_unknown_6::ReportReflectionUsageTypeError
                  (this->descriptor_,field,"SetRepeatedString",CPPTYPE_STRING);
      }
      if ((field->field_0x1 & 8) == 0) {
        CVar2 = FieldDescriptor::cpp_string_type(field);
        if ((CVar2 == kView) || (CVar2 == kString)) {
          this_00 = MutableRepeatedField<std::__cxx11::string>(this,message,field,index);
          std::__cxx11::string::operator=((string *)this_00,(string *)value);
          return;
        }
        if (CVar2 == kCord) {
          src._M_str = (value->_M_dataplus)._M_p;
          src._M_len = value->_M_string_length;
          absl::lts_20250127::Cord::Cord(&CStack_58,src);
          SetRepeatedField<absl::lts_20250127::Cord>(this,message,field,index,&CStack_58);
          absl::lts_20250127::Cord::~Cord(&CStack_58);
        }
      }
      else {
        uVar3 = internal::ReflectionSchema::GetExtensionSetOffset(&this->schema_);
        number = field->number_;
        std::__cxx11::string::string((string *)&local_48,(string *)value);
        internal::ExtensionSet::SetRepeatedString
                  ((ExtensionSet *)
                   ((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3),number,
                   index,&local_48);
        std::__cxx11::string::~string((string *)&local_48);
      }
      return;
    }
    pDVar4 = this->descriptor_;
    description = "Field is singular; the method requires a repeated field.";
  }
  else {
    description = "Field does not match message type.";
  }
  anon_unknown_6::ReportReflectionUsageError(pDVar4,field,"SetRepeatedString",description);
}

Assistant:

void Reflection::SetRepeatedString(Message* message,
                                   const FieldDescriptor* field, int index,
                                   std::string value) const {
  USAGE_MUTABLE_CHECK_ALL(SetRepeatedString, REPEATED, STRING);
  if (field->is_extension()) {
    MutableExtensionSet(message)->SetRepeatedString(field->number(), index,
                                                    std::move(value));
  } else {
    switch (field->cpp_string_type()) {
      case FieldDescriptor::CppStringType::kCord:
        SetRepeatedField<absl::Cord>(message, field, index, absl::Cord(value));
        break;
      case FieldDescriptor::CppStringType::kView:
      case FieldDescriptor::CppStringType::kString:
        MutableRepeatedField<std::string>(message, field, index)
            ->assign(std::move(value));
        break;
    }
  }
}